

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

uint __thiscall
capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage::allocateFromHole
          (DataLocationUsage *this,Group *group,DataLocation *location,uint lgSize)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  ulong uVar5;
  uchar local_2a;
  byte local_29;
  
  bVar4 = (byte)lgSize;
  if (this->isUsed == false) {
    this->isUsed = true;
    this->lgSizeUsed = bVar4;
    uVar3 = 0;
  }
  else {
    bVar1 = this->lgSizeUsed;
    uVar5 = (ulong)bVar1;
    if (lgSize < bVar1) {
      HoleSet<unsigned_char>::tryAllocate((HoleSet<unsigned_char> *)&local_2a,(uchar)&this->holes);
      if (local_2a == '\x01') {
        uVar3 = (uint)local_29;
      }
      else {
        bVar1 = this->lgSizeUsed;
        uVar3 = 1 << (bVar1 - bVar4 & 0x1f);
        if (bVar4 < bVar1) {
          uVar2 = uVar3 + 1;
          uVar5 = (ulong)(lgSize & 0xff);
          do {
            (this->holes).holes[uVar5] = (uchar)uVar2;
            uVar5 = uVar5 + 1;
            uVar2 = (uVar2 & 0xff) + 1 >> 1;
          } while (bVar1 != uVar5);
        }
        this->lgSizeUsed = bVar1 + 1;
      }
    }
    else {
      if (bVar1 < bVar4) {
        do {
          (this->holes).holes[uVar5] = '\x01';
          uVar5 = uVar5 + 1;
        } while (uVar5 < (lgSize & 7));
      }
      this->lgSizeUsed = bVar4 + 1;
      uVar3 = 1;
    }
  }
  return (location->offset << ((char)location->lgSize - bVar4 & 0x1f)) + uVar3;
}

Assistant:

uint allocateFromHole(Group& group, Union::DataLocation& location, uint lgSize) {
        // Allocate the given space from an existing hole, given smallestHoleAtLeast() already
        // returned non-null indicating such a hole exists.

        uint result;

        if (!isUsed) {
          // The location is totally unused, so just allocate from the beginning.
          KJ_DASSERT(lgSize <= location.lgSize, "Did smallestHoleAtLeast() really find a hole?");
          result = 0;
          isUsed = true;
          lgSizeUsed = lgSize;
        } else if (lgSize >= lgSizeUsed) {
          // Requested size is at least our current usage, so clearly won't fit in any holes.
          // We must expand to double the requested size, and return the second half.
          KJ_DASSERT(lgSize < location.lgSize, "Did smallestHoleAtLeast() really find a hole?");
          holes.addHolesAtEnd(lgSizeUsed, 1, lgSize);
          lgSizeUsed = lgSize + 1;
          result = 1;
        } else KJ_IF_SOME(hole, holes.tryAllocate(lgSize)) {
          // Found a hole.
          result = hole;
        } else {
          // The requested size is smaller than what we're using so far, but didn't fit in a
          // hole.  We should double our "used" size, then allocate from the new space.
          KJ_DASSERT(lgSizeUsed < location.lgSize,
                     "Did smallestHoleAtLeast() really find a hole?");
          result = 1 << (lgSizeUsed - lgSize);
          holes.addHolesAtEnd(lgSize, result + 1, lgSizeUsed);
          lgSizeUsed += 1;
        }